

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageUtil.cpp
# Opt level: O0

ssize_t __thiscall
vkt::pipeline::TestTexture::write(TestTexture *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  CompressedTexFormat format;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *dst;
  void *src;
  TextureFormat *pTVar6;
  IVec3 *size;
  IVec3 *pitch;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  undefined1 local_e0 [8];
  PixelBufferAccess destAccess;
  ConstPixelBufferAccess srcAccess;
  int layerNdx_1;
  int levelNdx_1;
  value_type_conflict2 local_5c;
  CompressedTexture *local_58;
  CompressedTexture *compressedTex;
  int layerNdx;
  int levelNdx;
  value_type_conflict2 local_38;
  deUint32 local_34;
  undefined1 local_30 [4];
  deUint32 levelOffset;
  vector<unsigned_int,_std::allocator<unsigned_int>_> offsetMultiples;
  deUint8 *destPtr_local;
  TestTexture *this_local;
  
  offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(in_register_00000034,__fd);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30);
  local_34 = 0;
  local_38 = 4;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30,&local_38);
  uVar1 = (*this->_vptr_TestTexture[5])();
  if ((uVar1 & 1) == 0) {
    (*this->_vptr_TestTexture[8])(&layerNdx_1,this,0);
    pTVar6 = tcu::ConstPixelBufferAccess::getFormat((ConstPixelBufferAccess *)&layerNdx_1);
    local_5c = tcu::TextureFormat::getPixelSize(pTVar6);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30,&local_5c);
    for (srcAccess.m_data._4_4_ = 0; iVar2 = (*this->_vptr_TestTexture[2])(),
        (int)srcAccess.m_data._4_4_ < iVar2; srcAccess.m_data._4_4_ = srcAccess.m_data._4_4_ + 1) {
      for (srcAccess.m_data._0_4_ = 0; iVar2 = (*this->_vptr_TestTexture[4])(),
          (int)(uint)srcAccess.m_data < iVar2; srcAccess.m_data._0_4_ = (uint)srcAccess.m_data + 1)
      {
        local_34 = getNextMultiple((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30,
                                   local_34);
        (*this->_vptr_TestTexture[8])
                  (&destAccess.super_ConstPixelBufferAccess.m_data,this,
                   (ulong)srcAccess.m_data._4_4_,(ulong)(uint)srcAccess.m_data);
        pTVar6 = tcu::ConstPixelBufferAccess::getFormat
                           ((ConstPixelBufferAccess *)
                            &destAccess.super_ConstPixelBufferAccess.m_data);
        size = tcu::ConstPixelBufferAccess::getSize
                         ((ConstPixelBufferAccess *)&destAccess.super_ConstPixelBufferAccess.m_data)
        ;
        pitch = tcu::ConstPixelBufferAccess::getPitch
                          ((ConstPixelBufferAccess *)&destAccess.super_ConstPixelBufferAccess.m_data
                          );
        tcu::PixelBufferAccess::PixelBufferAccess
                  ((PixelBufferAccess *)local_e0,pTVar6,size,pitch,
                   (void *)((long)offsetMultiples.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage +
                           (ulong)local_34));
        tcu::copy((EVP_PKEY_CTX *)local_e0,
                  (EVP_PKEY_CTX *)&destAccess.super_ConstPixelBufferAccess.m_data);
        iVar2 = tcu::ConstPixelBufferAccess::getWidth
                          ((ConstPixelBufferAccess *)&destAccess.super_ConstPixelBufferAccess.m_data
                          );
        iVar3 = tcu::ConstPixelBufferAccess::getHeight
                          ((ConstPixelBufferAccess *)&destAccess.super_ConstPixelBufferAccess.m_data
                          );
        iVar4 = tcu::ConstPixelBufferAccess::getDepth
                          ((ConstPixelBufferAccess *)&destAccess.super_ConstPixelBufferAccess.m_data
                          );
        pTVar6 = tcu::ConstPixelBufferAccess::getFormat
                           ((ConstPixelBufferAccess *)
                            &destAccess.super_ConstPixelBufferAccess.m_data);
        iVar5 = tcu::TextureFormat::getPixelSize(pTVar6);
        local_34 = iVar2 * iVar3 * iVar4 * iVar5 + local_34;
      }
    }
  }
  else {
    iVar2 = (*this->_vptr_TestTexture[10])(this,0);
    format = tcu::CompressedTexture::getFormat((CompressedTexture *)CONCAT44(extraout_var,iVar2));
    layerNdx = tcu::getBlockSize(format);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30,
               (value_type_conflict2 *)&layerNdx);
    for (compressedTex._4_4_ = 0; uVar1 = compressedTex._4_4_,
        iVar2 = (*this->_vptr_TestTexture[2])(), (int)uVar1 < iVar2;
        compressedTex._4_4_ = compressedTex._4_4_ + 1) {
      for (compressedTex._0_4_ = 0; uVar1 = (uint)compressedTex,
          iVar2 = (*this->_vptr_TestTexture[4])(), (int)uVar1 < iVar2;
          compressedTex._0_4_ = (uint)compressedTex + 1) {
        local_34 = getNextMultiple((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30,
                                   local_34);
        iVar2 = (*this->_vptr_TestTexture[10])
                          (this,(ulong)compressedTex._4_4_,(ulong)(uint)compressedTex);
        local_58 = (CompressedTexture *)CONCAT44(extraout_var_00,iVar2);
        dst = (void *)((long)offsetMultiples.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage + (ulong)local_34);
        src = tcu::CompressedTexture::getData(local_58);
        iVar2 = tcu::CompressedTexture::getDataSize(local_58);
        ::deMemcpy(dst,src,(long)iVar2);
        iVar2 = tcu::CompressedTexture::getDataSize(local_58);
        local_34 = iVar2 + local_34;
      }
    }
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30);
  return extraout_RAX;
}

Assistant:

void TestTexture::write (deUint8* destPtr) const
{
	std::vector<deUint32>	offsetMultiples;
	deUint32				levelOffset		= 0;

	offsetMultiples.push_back(4);

	if (isCompressed())
	{
		offsetMultiples.push_back(tcu::getBlockSize(getCompressedLevel(0, 0).getFormat()));

		for (int levelNdx = 0; levelNdx < getNumLevels(); levelNdx++)
		{
			for (int layerNdx = 0; layerNdx < getArraySize(); layerNdx++)
			{
				levelOffset = getNextMultiple(offsetMultiples, levelOffset);

				const tcu::CompressedTexture&		compressedTex	= getCompressedLevel(levelNdx, layerNdx);

				deMemcpy(destPtr + levelOffset, compressedTex.getData(), compressedTex.getDataSize());
				levelOffset += compressedTex.getDataSize();
			}
		}
	}
	else
	{
		offsetMultiples.push_back(getLevel(0, 0).getFormat().getPixelSize());

		for (int levelNdx = 0; levelNdx < getNumLevels(); levelNdx++)
		{
			for (int layerNdx = 0; layerNdx < getArraySize(); layerNdx++)
			{
				levelOffset = getNextMultiple(offsetMultiples, levelOffset);

				const tcu::ConstPixelBufferAccess	srcAccess		= getLevel(levelNdx, layerNdx);
				const tcu::PixelBufferAccess		destAccess		(srcAccess.getFormat(), srcAccess.getSize(), srcAccess.getPitch(), destPtr + levelOffset);

				tcu::copy(destAccess, srcAccess);
				levelOffset += srcAccess.getWidth() * srcAccess.getHeight() * srcAccess.getDepth() * srcAccess.getFormat().getPixelSize();
			}
		}
	}
}